

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

string * CLI::detail::fix_newlines(string *leader,string *input)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  string *in_RDX;
  string *in_RDI;
  bool bVar3;
  size_type n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60 [32];
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    bVar3 = false;
    if (local_20 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
      in_stack_ffffffffffffff28 = local_20;
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::__cxx11::string::size();
      bVar3 = in_stack_ffffffffffffff28 < pbVar1;
    }
    if (!bVar3) break;
    local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::__cxx11::string::find((char)in_RDX,10);
    if (local_20 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
      pbVar1 = &local_80;
      ::std::__cxx11::string::substr((ulong)pbVar1,(ulong)in_RDX);
      ::std::operator+(in_stack_ffffffffffffff28,pbVar1);
      ::std::__cxx11::string::substr((ulong)&stack0xffffffffffffff50,(ulong)in_RDX);
      ::std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      ::std::__cxx11::string::operator=(in_RDX,local_40);
      ::std::__cxx11::string::~string(local_40);
      ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
      ::std::__cxx11::string::~string(local_60);
      ::std::__cxx11::string::~string((string *)&local_80);
      lVar2 = ::std::__cxx11::string::size();
      local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (&local_20->_M_dataplus + lVar2);
    }
  }
  ::std::__cxx11::string::string((string *)in_RDI,in_RDX);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string fix_newlines(const std::string &leader, std::string input) {
    std::string::size_type n = 0;
    while(n != std::string::npos && n < input.size()) {
        n = input.find('\n', n);
        if(n != std::string::npos) {
            input = input.substr(0, n + 1) + leader + input.substr(n + 1);
            n += leader.size();
        }
    }
    return input;
}